

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

void __thiscall Map::Emote(Map *this,Character *from,Emote emote,bool echo)

{
  Character *other;
  bool bVar1;
  int num;
  reference ppCVar2;
  Character *character;
  iterator __end1;
  iterator __begin1;
  list<Character_*,_std::allocator<Character_*>_> *__range1;
  undefined1 local_50 [8];
  PacketBuilder builder;
  bool echo_local;
  Emote emote_local;
  Character *from_local;
  Map *this_local;
  
  builder.add_size._6_1_ = echo;
  builder.add_size._7_1_ = emote;
  PacketBuilder::PacketBuilder((PacketBuilder *)local_50,PACKET_EMOTE,PACKET_PLAYER,3);
  num = Character::PlayerID(from);
  PacketBuilder::AddShort((PacketBuilder *)local_50,num);
  PacketBuilder::AddChar((PacketBuilder *)local_50,(uint)builder.add_size._7_1_);
  __end1 = std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::begin(&this->characters);
  character = (Character *)
              std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::end(&this->characters);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&character), bVar1) {
    ppCVar2 = std::_List_iterator<Character_*>::operator*(&__end1);
    other = *ppCVar2;
    if (((builder.add_size._6_1_ & 1) != 0) ||
       ((other != from && (bVar1 = Character::InRange(from,other), bVar1)))) {
      Character::Send(other,(PacketBuilder *)local_50);
    }
    std::_List_iterator<Character_*>::operator++(&__end1);
  }
  PacketBuilder::~PacketBuilder((PacketBuilder *)local_50);
  return;
}

Assistant:

void Map::Emote(Character *from, enum Emote emote, bool echo)
{
	PacketBuilder builder(PACKET_EMOTE, PACKET_PLAYER, 3);
	builder.AddShort(from->PlayerID());
	builder.AddChar(emote);

	UTIL_FOREACH(this->characters, character)
	{
		if (!echo && (character == from || !from->InRange(character)))
		{
			continue;
		}

		character->Send(builder);
	}
}